

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListCase.cpp
# Opt level: O1

char * glcts::getConfigTypeName(ConfigType type)

{
  Exception *this;
  string local_40;
  
  if (type < CONFIGTYPE_LAST) {
    return &DAT_01bd5258 + *(int *)(&DAT_01bd5258 + (ulong)type * 4);
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unknown config type","");
  tcu::Exception::Exception(this,&local_40);
  __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static const char* getConfigTypeName(ConfigType type)
{
	switch (type)
	{
	case CONFIGTYPE_DEFAULT:
		return "default";
	case CONFIGTYPE_EGL:
		return "EGL";
	case CONFIGTYPE_WGL:
		return "WGL";
	default:
		throw tcu::Exception("Unknown config type");
	}
}